

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr_time.c
# Opt level: O3

void chr_timer_sum(chr_time *sum,chr_time *src1,chr_time *src2)

{
  double dVar1;
  double dVar2;
  timeval *s2;
  timeval *s1;
  
  dVar1 = (double)((long)src2->d2 + (long)src1->d2);
  dVar2 = (double)((long)src2->d2 + -1000000 + (long)src1->d2);
  if ((long)dVar1 < 0xf4241) {
    dVar2 = dVar1;
  }
  sum->d1 = (double)((ulong)(1000000 < (long)dVar1) + (long)src2->d1 + (long)src1->d1);
  sum->d2 = dVar2;
  return;
}

Assistant:

extern void
chr_timer_sum( chr_time *sum, chr_time *src1, chr_time *src2)
{
    struct timeval s;
    struct timeval *s1 = (struct timeval *)src1;
    struct timeval *s2 = (struct timeval *)src2;
    s.tv_sec = s1->tv_sec + s2->tv_sec;
    s.tv_usec = s1->tv_usec + s2->tv_usec;
    if (s.tv_usec > 1000000) {
	s.tv_usec -= 1000000;
	s.tv_sec++;
    }
    *((struct timeval*)sum) = s;
}